

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall re2::DFA::StateSaver::StateSaver(StateSaver *this,DFA *dfa,State *state)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int *piVar3;
  State *state_local;
  DFA *dfa_local;
  StateSaver *this_local;
  
  this->dfa_ = dfa;
  if (state < (State *)0x3) {
    this->inst_ = (int *)0x0;
    this->ninst_ = 0;
    this->flag_ = 0;
    this->is_special_ = true;
    this->special_ = state;
  }
  else {
    this->is_special_ = false;
    this->special_ = (State *)0x0;
    this->flag_ = state->flag_;
    this->ninst_ = state->ninst_;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)this->ninst_;
    uVar2 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    piVar3 = (int *)operator_new__(uVar2);
    this->inst_ = piVar3;
    memmove(this->inst_,state->inst_,(long)this->ninst_ << 2);
  }
  return;
}

Assistant:

DFA::StateSaver::StateSaver(DFA* dfa, State* state) {
  dfa_ = dfa;
  if (state <= SpecialStateMax) {
    inst_ = NULL;
    ninst_ = 0;
    flag_ = 0;
    is_special_ = true;
    special_ = state;
    return;
  }
  is_special_ = false;
  special_ = NULL;
  flag_ = state->flag_;
  ninst_ = state->ninst_;
  inst_ = new int[ninst_];
  memmove(inst_, state->inst_, ninst_*sizeof inst_[0]);
}